

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O1

void Ivy_ManHaigStart(Ivy_Man_t *p,int fVerbose)

{
  undefined4 uVar1;
  uint uVar2;
  undefined4 *puVar3;
  Ivy_Man_t *pIVar4;
  uint *puVar5;
  void *pvVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  long lVar9;
  
  if (p->pHaig != (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyHaig.c"
                  ,99,"void Ivy_ManHaigStart(Ivy_Man_t *, int)");
  }
  pIVar4 = Ivy_ManDup(p);
  p->pHaig = pIVar4;
  if (fVerbose != 0) {
    printf("Starting : ");
    Ivy_ManPrintStats(p->pHaig);
  }
  puVar5 = (uint *)malloc(0x10);
  puVar5[0] = 100;
  puVar5[1] = 0;
  pvVar6 = malloc(400);
  *(void **)(puVar5 + 2) = pvVar6;
  pIVar4 = p->pHaig;
  pVVar7 = pIVar4->vObjs;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      puVar3 = (undefined4 *)pVVar7->pArray[lVar9];
      if ((puVar3 != (undefined4 *)0x0) && ((puVar3[2] & 0xf) == 4)) {
        puVar3[2] = puVar3[2] | 0x600;
        uVar1 = *puVar3;
        uVar2 = *puVar5;
        if (puVar5[1] == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (*(void **)(puVar5 + 2) == (void *)0x0) {
              pvVar6 = malloc(0x40);
            }
            else {
              pvVar6 = realloc(*(void **)(puVar5 + 2),0x40);
            }
            *(void **)(puVar5 + 2) = pvVar6;
            uVar8 = 0x10;
          }
          else {
            uVar8 = uVar2 * 2;
            if ((int)uVar8 <= (int)uVar2) goto LAB_007563f8;
            if (*(void **)(puVar5 + 2) == (void *)0x0) {
              pvVar6 = malloc((ulong)uVar2 << 3);
            }
            else {
              pvVar6 = realloc(*(void **)(puVar5 + 2),(ulong)uVar2 << 3);
            }
            *(void **)(puVar5 + 2) = pvVar6;
          }
          if (pvVar6 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          *puVar5 = uVar8;
        }
LAB_007563f8:
        uVar2 = puVar5[1];
        puVar5[1] = uVar2 + 1;
        *(undefined4 *)(*(long *)(puVar5 + 2) + (long)(int)uVar2 * 4) = uVar1;
      }
      lVar9 = lVar9 + 1;
      pIVar4 = p->pHaig;
      pVVar7 = pIVar4->vObjs;
    } while (lVar9 < pVVar7->nSize);
  }
  pIVar4->pData = puVar5;
  return;
}

Assistant:

void Ivy_ManHaigStart( Ivy_Man_t * p, int fVerbose )
{
    Vec_Int_t * vLatches;
    Ivy_Obj_t * pObj;
    int i;
    assert( p->pHaig == NULL );
    p->pHaig = Ivy_ManDup( p );

    if ( fVerbose )
    {
        printf( "Starting : " );
        Ivy_ManPrintStats( p->pHaig );
    }

    // collect latches of design D and set their values to be DC
    vLatches = Vec_IntAlloc( 100 );
    Ivy_ManForEachLatch( p->pHaig, pObj, i )
    {
        pObj->Init = IVY_INIT_DC;
        Vec_IntPush( vLatches, pObj->Id );
    }
    p->pHaig->pData = vLatches;
/*
    {
        int x;
        Ivy_ManShow( p, 0, NULL );
        Ivy_ManShow( p->pHaig, 1, NULL );
        x = 0;
    }
*/
}